

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpn.c
# Opt level: O3

void Abc_TruthNpnPrint(char *pCanonPermInit,uint uCanonPhase,int nVars)

{
  ulong uVar1;
  char cVar2;
  char *pcVar3;
  char pCanonPerm [16];
  char local_48 [24];
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcNpn.c"
                  ,0x9d,"void Abc_TruthNpnPrint(char *, unsigned int, int)");
  }
  if (nVars < 1) {
    printf("   %c = ( ",(ulong)((uint)((uCanonPhase >> (nVars & 0x1fU) & 1) == 0) << 5 | 0x5a));
  }
  else {
    uVar1 = 0;
    do {
      if (pCanonPermInit == (char *)0x0) {
        cVar2 = (char)uVar1 + 'a';
      }
      else {
        cVar2 = pCanonPermInit[uVar1];
      }
      local_48[uVar1] = cVar2;
      uVar1 = uVar1 + 1;
    } while ((uint)nVars != uVar1);
    printf("   %c = ( ",(ulong)((uint)((uCanonPhase >> (nVars & 0x1fU) & 1) == 0) << 5 | 0x5a));
    if (0 < nVars) {
      uVar1 = 0;
      do {
        pcVar3 = ",";
        if (nVars - 1 == uVar1) {
          pcVar3 = "";
        }
        printf("%c%s",(ulong)((int)local_48[uVar1] +
                             (uCanonPhase >> (local_48[uVar1] - 1U & 0x1f) & 1) * -0x20),pcVar3);
        uVar1 = uVar1 + 1;
      } while ((uint)nVars != uVar1);
    }
  }
  printf(" )  ");
  return;
}

Assistant:

void Abc_TruthNpnPrint( char * pCanonPermInit, unsigned uCanonPhase, int nVars )
{
    char pCanonPerm[16]; int i;
    assert( nVars <= 16 );
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = pCanonPermInit ? pCanonPermInit[i] : 'a' + i;
    printf( "   %c = ( ", Abc_InfoHasBit(&uCanonPhase, nVars) ? 'Z':'z' );
    for ( i = 0; i < nVars; i++ )
        printf( "%c%s", pCanonPerm[i] + ('A'-'a') * Abc_InfoHasBit(&uCanonPhase, pCanonPerm[i]-'a'), i == nVars-1 ? "":"," );
    printf( " )  " );
}